

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

QSize __thiscall QWatermarkLabel::minimumSizeHint(QWatermarkLabel *this)

{
  byte bVar1;
  QLabel *in_RDI;
  long in_FS_OFFSET;
  QWidget *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  QSize local_50;
  QPixmap local_48 [24];
  undefined8 local_30;
  QPixmap local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QLabel::pixmap(in_RDI);
  bVar1 = QPixmap::isNull();
  bVar1 = bVar1 ^ 0xff;
  QPixmap::~QPixmap(local_20);
  if ((bVar1 & 1) == 0) {
    local_50 = QWidget::minimumSizeHint(in_stack_ffffffffffffff90);
  }
  else {
    QLabel::pixmap(in_RDI);
    local_30 = QPixmap::deviceIndependentSize();
    local_50 = QSizeF::toSize((QSizeF *)CONCAT17(bVar1,in_stack_ffffffffffffffa0));
    QPixmap::~QPixmap(local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

QSize minimumSizeHint() const override {
        if (!pixmap().isNull())
            return pixmap().deviceIndependentSize().toSize();
        return QFrame::minimumSizeHint();
    }